

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::BaseTag::ComputeDefaultActions(BaseTag *this,string *type)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  int a;
  ACT_TYPE a_00;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    (**(code **)(*(long *)this + 0x30))(this);
    uVar4 = (**(code **)(*(long *)this + 0x10))(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      lVar7 = *(long *)&this->field_0x8;
      piVar1 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        *(undefined4 *)((long)piVar1 + lVar6) = *(undefined4 *)(lVar7 + lVar6 * 4);
        lVar6 = lVar6 + 4;
      } while ((ulong)uVar4 << 2 != lVar6);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type);
    if (iVar2 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
      poVar5 = std::operator<<(poVar5,(string *)type);
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(1);
    }
    iVar2 = (**(code **)(*(long *)this + 0x10))(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)iVar2);
    iVar2 = (**(code **)(*(long *)this + 0x10))(this);
    if (0 < iVar2) {
      iVar2 = (int)this + 0x58;
      lVar7 = 0;
      do {
        piVar1 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar1[lVar7] = 0;
        iVar3 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if (iVar3 == (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7]) {
          piVar1[lVar7] = 4;
        }
        else {
          dVar8 = (double)despot::Floor::Distance(iVar2,iVar3);
          a_00 = 0;
          do {
            iVar3 = NextRobPosition(this,(this->rob_).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[lVar7],a_00);
            dVar9 = (double)despot::Floor::Distance(iVar2,iVar3);
            if (dVar9 < dVar8) {
              (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] = a_00;
              break;
            }
            a_00 = a_00 + 1;
          } while (a_00 != 4);
        }
        lVar7 = lVar7 + 1;
        iVar3 = (**(code **)(*(long *)this + 0x10))(this);
      } while (lVar7 < iVar3);
    }
  }
  return;
}

Assistant:

void BaseTag::ComputeDefaultActions(string type) const {
	if (type == "MDP") {
		const_cast<BaseTag*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);

		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
		}
	} else if (type == "SP") {
		// Follow the shortest path from the robot to the opponent
		default_action_.resize(NumStates());
		for (int s = 0; s < NumStates(); s++) {
			default_action_[s] = 0;
			if (rob_[s] == opp_[s]) {
				default_action_[s] = TagAction();
			} else {
				double cur_dist = floor_.Distance(rob_[s], opp_[s]);
				for (int a = 0; a < 4; a++) {
					int next = NextRobPosition(rob_[s], a);
					double dist = floor_.Distance(next, opp_[s]);

					if (dist < cur_dist) {
						default_action_[s] = a;
						break;
					}
				}
			}
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(1);
	}
}